

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cVertexAttribBindingTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::AdvancedIterations::Run(AdvancedIterations *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  GLuint shader;
  int iVar3;
  uint *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  char *format;
  ulong uVar8;
  int i;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  char *glsl_fs;
  char *glsl_vs;
  IVec4 zero;
  char *local_58;
  char *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_50 = 
  "#version 310 es\nin ivec4 vs_in_data;\nflat out ivec4 data;\nvoid main() {\n  data = vs_in_data + 1;\n}"
  ;
  local_58 = 
  "#version 310 es\nprecision mediump float;\nflat in ivec4 data;\nout vec4 fs_out_color;\nvoid main() {\n  fs_out_color = vec4(data);\n}"
  ;
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  GVar2 = glu::CallLogWrapper::glCreateProgram(this_00);
  this->m_po = GVar2;
  GVar2 = glu::CallLogWrapper::glCreateShader(this_00,0x8b31);
  shader = glu::CallLogWrapper::glCreateShader(this_00,0x8b30);
  uVar9 = 0;
  glu::CallLogWrapper::glShaderSource(this_00,GVar2,1,&local_50,(GLint *)0x0);
  glu::CallLogWrapper::glShaderSource(this_00,shader,1,&local_58,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader(this_00,GVar2);
  glu::CallLogWrapper::glCompileShader(this_00,shader);
  glu::CallLogWrapper::glAttachShader(this_00,this->m_po,GVar2);
  glu::CallLogWrapper::glAttachShader(this_00,this->m_po,shader);
  glu::CallLogWrapper::glDeleteShader(this_00,GVar2);
  glu::CallLogWrapper::glDeleteShader(this_00,shader);
  bVar1 = RelinkProgram(this,1);
  if (!bVar1) {
    return -1;
  }
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,this->m_buffer[0]);
  local_48 = 0;
  uStack_40 = 0;
  glu::CallLogWrapper::glBufferData(this_00,0x8892,0x10,&local_48,0x88e4);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,0);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,this->m_buffer[1]);
  glu::CallLogWrapper::glBufferData(this_00,0x8c8e,0x10,&local_48,0x88e9);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8c8e,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,1,4,0x1404,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,1,this->m_buffer[0],0,0x10);
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[1]);
  glu::CallLogWrapper::glVertexAttribIFormat(this_00,1,4,0x1404,0);
  glu::CallLogWrapper::glEnableVertexAttribArray(this_00,1);
  glu::CallLogWrapper::glBindVertexBuffer(this_00,1,this->m_buffer[1],0,0x10);
  glu::CallLogWrapper::glBindVertexArray(this_00,0);
  glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[0]);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_buffer[1]);
  glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[1]);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_buffer[0]);
  glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,0);
  glu::CallLogWrapper::glEnable(this_00,0x8c89);
  glu::CallLogWrapper::glUseProgram(this_00,this->m_po);
  do {
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[uVar9 & 1]);
    glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[uVar9 & 1]);
    glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
    glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
    glu::CallLogWrapper::glEndTransformFeedback(this_00);
    uVar9 = uVar9 + 1;
  } while (uVar9 != 10);
  puVar4 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x8c8e,0,0x10,1);
  auVar10._0_4_ = -(uint)(*puVar4 == 10);
  auVar10._4_4_ = -(uint)(puVar4[1] == 10);
  auVar10._8_4_ = -(uint)(puVar4[2] == 10);
  auVar10._12_4_ = -(uint)(puVar4[3] == 10);
  iVar3 = movmskps((int)puVar4,auVar10);
  if (iVar3 == 0xf) {
    glu::CallLogWrapper::glUnmapBuffer(this_00,0x8c8e);
    bVar1 = RelinkProgram(this,5);
    if (!bVar1) {
      return -1;
    }
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
    glu::CallLogWrapper::glDisableVertexAttribArray(this_00,1);
    uVar9 = 0;
    glu::CallLogWrapper::glBindVertexBuffer(this_00,1,0,0,0);
    glu::CallLogWrapper::glVertexAttribIFormat(this_00,5,4,0x1404,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,5);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,5,this->m_buffer[0],0,0x10);
    glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[1]);
    glu::CallLogWrapper::glDisableVertexAttribArray(this_00,1);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,1,0,0,0);
    glu::CallLogWrapper::glVertexAttribIFormat(this_00,5,4,0x1404,0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,5);
    glu::CallLogWrapper::glBindVertexBuffer(this_00,7,this->m_buffer[1],0,0x10);
    glu::CallLogWrapper::glVertexAttribBinding(this_00,5,7);
    glu::CallLogWrapper::glBindVertexArray(this_00,0);
    do {
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[uVar9 & 1]);
      glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,this->m_xfo[uVar9 & 1]);
      glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glEndTransformFeedback(this_00);
      uVar9 = uVar9 + 1;
    } while (uVar9 != 10);
    puVar4 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x8c8e,0,0x10,1);
    auVar11._0_4_ = -(uint)(*puVar4 == 0x14);
    auVar11._4_4_ = -(uint)(puVar4[1] == 0x14);
    auVar11._8_4_ = -(uint)(puVar4[2] == 0x14);
    auVar11._12_4_ = -(uint)(puVar4[3] == 0x14);
    iVar3 = movmskps((int)puVar4,auVar11);
    if (iVar3 == 0xf) {
      glu::CallLogWrapper::glUnmapBuffer(this_00,0x8c8e);
      bVar1 = RelinkProgram(this,0xb);
      if (!bVar1) {
        return -1;
      }
      glu::CallLogWrapper::glBindTransformFeedback(this_00,0x8e22,0);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao[0]);
      glu::CallLogWrapper::glDisableVertexAttribArray(this_00,5);
      glu::CallLogWrapper::glBindVertexBuffer(this_00,5,0,0,0);
      glu::CallLogWrapper::glVertexAttribIFormat(this_00,0xb,4,0x1404,0);
      glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0xb);
      uVar9 = 1;
      do {
        glu::CallLogWrapper::glBindVertexBuffer(this_00,0xb,this->m_buffer[uVar9 - 1 & 1],0,0x10);
        glu::CallLogWrapper::glBindBufferBase(this_00,0x8c8e,0,this->m_buffer[uVar9 & 1]);
        glu::CallLogWrapper::glBeginTransformFeedback(this_00,0);
        glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
        glu::CallLogWrapper::glEndTransformFeedback(this_00);
        uVar9 = uVar9 + 1;
      } while (uVar9 != 0xb);
      puVar4 = (uint *)glu::CallLogWrapper::glMapBufferRange(this_00,0x8c8e,0,0x10,1);
      auVar12._0_4_ = -(uint)(*puVar4 == 0x1e);
      auVar12._4_4_ = -(uint)(puVar4[1] == 0x1e);
      auVar12._8_4_ = -(uint)(puVar4[2] == 0x1e);
      auVar12._12_4_ = -(uint)(puVar4[3] == 0x1e);
      iVar3 = movmskps((int)puVar4,auVar12);
      if (iVar3 == 0xf) {
        return 0;
      }
      uVar7 = (ulong)*puVar4;
      uVar6 = (ulong)puVar4[1];
      uVar5 = (ulong)puVar4[2];
      uVar8 = (ulong)puVar4[3];
      format = "Data is: %d %d %d %d, data should be: 30 30 30 30.\n";
    }
    else {
      uVar7 = (ulong)*puVar4;
      uVar6 = (ulong)puVar4[1];
      uVar5 = (ulong)puVar4[2];
      uVar8 = (ulong)puVar4[3];
      format = "Data is: %d %d %d %d, data should be: 20 20 20 20.\n";
    }
  }
  else {
    uVar7 = (ulong)*puVar4;
    uVar6 = (ulong)puVar4[1];
    uVar5 = (ulong)puVar4[2];
    uVar8 = (ulong)puVar4[3];
    format = "Data is: %d %d %d %d, data should be: 10 10 10 10.\n";
  }
  anon_unknown_0::Output(format,uVar7,uVar6,uVar5,uVar8);
  return -1;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_vs = "#version 310 es" NL "in ivec4 vs_in_data;" NL "flat out ivec4 data;" NL
									"void main() {" NL "  data = vs_in_data + 1;" NL "}";
		const char* const glsl_fs =
			"#version 310 es" NL "precision mediump float;" NL "flat in ivec4 data;" NL "out vec4 fs_out_color;" NL
			"void main() {" NL "  fs_out_color = vec4(data);" NL "}";
		m_po = glCreateProgram();
		/* attach shader */
		{
			const GLuint sh  = glCreateShader(GL_VERTEX_SHADER);
			const GLuint fsh = glCreateShader(GL_FRAGMENT_SHADER);
			glShaderSource(sh, 1, &glsl_vs, NULL);
			glShaderSource(fsh, 1, &glsl_fs, NULL);
			glCompileShader(sh);
			glCompileShader(fsh);
			glAttachShader(m_po, sh);
			glAttachShader(m_po, fsh);
			glDeleteShader(sh);
			glDeleteShader(fsh);
		}
		if (!RelinkProgram(1))
			return ERROR;

		glBindBuffer(GL_ARRAY_BUFFER, m_buffer[0]);
		IVec4 zero(0);
		glBufferData(GL_ARRAY_BUFFER, 16, &zero, GL_STATIC_DRAW);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_buffer[1]);
		glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, &zero, GL_DYNAMIC_READ);
		glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, 0);

		glBindVertexArray(m_vao[0]);
		glVertexAttribIFormat(1, 4, GL_INT, 0);
		glEnableVertexAttribArray(1);
		glBindVertexBuffer(1, m_buffer[0], 0, 16);
		glBindVertexArray(m_vao[1]);
		glVertexAttribIFormat(1, 4, GL_INT, 0);
		glEnableVertexAttribArray(1);
		glBindVertexBuffer(1, m_buffer[1], 0, 16);
		glBindVertexArray(0);

		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[0]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[1]);
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[1]);
		glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[0]);
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_po);

		for (int i = 0; i < 10; ++i)
		{
			glBindVertexArray(m_vao[i % 2]);
			glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[i % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		/* */
		{
			IVec4* data =
				static_cast<IVec4*>(glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
			if (!IsEqual(*data, IVec4(10)))
			{
				Output("Data is: %d %d %d %d, data should be: 10 10 10 10.\n", (*data)[0], (*data)[1], (*data)[2],
					   (*data)[3]);
				return ERROR;
			}
			glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		}

		if (!RelinkProgram(5))
			return ERROR;
		glBindVertexArray(m_vao[0]);
		glDisableVertexAttribArray(1);
		glBindVertexBuffer(1, 0, 0, 0);
		glVertexAttribIFormat(5, 4, GL_INT, 0);
		glEnableVertexAttribArray(5);
		glBindVertexBuffer(5, m_buffer[0], 0, 16);
		glBindVertexArray(m_vao[1]);
		glDisableVertexAttribArray(1);
		glBindVertexBuffer(1, 0, 0, 0);
		glVertexAttribIFormat(5, 4, GL_INT, 0);
		glEnableVertexAttribArray(5);
		glBindVertexBuffer(7, m_buffer[1], 0, 16);
		glVertexAttribBinding(5, 7);
		glBindVertexArray(0);

		for (int i = 0; i < 10; ++i)
		{
			glBindVertexArray(m_vao[i % 2]);
			glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_xfo[i % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		/* */
		{
			IVec4* data =
				static_cast<IVec4*>(glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
			if (!IsEqual(*data, IVec4(20)))
			{
				Output("Data is: %d %d %d %d, data should be: 20 20 20 20.\n", (*data)[0], (*data)[1], (*data)[2],
					   (*data)[3]);
				return ERROR;
			}
			glUnmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		}

		if (!RelinkProgram(11))
			return ERROR;
		glBindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
		glBindVertexArray(m_vao[0]);
		glDisableVertexAttribArray(5);
		glBindVertexBuffer(5, 0, 0, 0);
		glVertexAttribIFormat(11, 4, GL_INT, 0);
		glEnableVertexAttribArray(11);
		for (int i = 0; i < 10; ++i)
		{
			glBindVertexBuffer(11, m_buffer[i % 2], 0, 16);
			glBindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_buffer[(i + 1) % 2]);
			glBeginTransformFeedback(GL_POINTS);
			glDrawArrays(GL_POINTS, 0, 1);
			glEndTransformFeedback();
		}
		/* */
		{
			IVec4* data =
				static_cast<IVec4*>(glMapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, sizeof(IVec4), GL_MAP_READ_BIT));
			if (!IsEqual(*data, IVec4(30)))
			{
				Output("Data is: %d %d %d %d, data should be: 30 30 30 30.\n", (*data)[0], (*data)[1], (*data)[2],
					   (*data)[3]);
				return ERROR;
			}
		}

		return NO_ERROR;
	}